

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int MOJOSHADER_maxShaderModel(char *profile)

{
  int iVar1;
  char *profile_local;
  
  iVar1 = strcmp(profile,"d3d");
  if (iVar1 == 0) {
    profile_local._4_4_ = 3;
  }
  else {
    iVar1 = strcmp(profile,"bytecode");
    if (iVar1 == 0) {
      profile_local._4_4_ = 3;
    }
    else {
      iVar1 = strcmp(profile,"glsl");
      if (iVar1 == 0) {
        profile_local._4_4_ = 3;
      }
      else {
        iVar1 = strcmp(profile,"glsl120");
        if (iVar1 == 0) {
          profile_local._4_4_ = 3;
        }
        else {
          iVar1 = strcmp(profile,"glsles");
          if (iVar1 == 0) {
            profile_local._4_4_ = 3;
          }
          else {
            iVar1 = strcmp(profile,"arb1");
            if (iVar1 == 0) {
              profile_local._4_4_ = 2;
            }
            else {
              iVar1 = strcmp(profile,"nv2");
              if (iVar1 == 0) {
                profile_local._4_4_ = 2;
              }
              else {
                iVar1 = strcmp(profile,"nv3");
                if (iVar1 == 0) {
                  profile_local._4_4_ = 2;
                }
                else {
                  iVar1 = strcmp(profile,"nv4");
                  if (iVar1 == 0) {
                    profile_local._4_4_ = 3;
                  }
                  else {
                    iVar1 = strcmp(profile,"metal");
                    if (iVar1 == 0) {
                      profile_local._4_4_ = 3;
                    }
                    else {
                      profile_local._4_4_ = -1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return profile_local._4_4_;
}

Assistant:

int MOJOSHADER_maxShaderModel(const char *profile)
{
    #define PROFILE_SHADER_MODEL(p,v) if (strcmp(profile, p) == 0) return v;
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_D3D, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_BYTECODE, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL120, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSLES, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_ARB1, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV2, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV3, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV4, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_METAL, 3);
    #undef PROFILE_SHADER_MODEL
    return -1;  // unknown profile?
}